

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O2

PSpriteAmiga __thiscall
DataSourceAmiga::SpriteAmiga::split_horizontaly(SpriteAmiga *this,bool return_right)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _func_int *p_Var2;
  int in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined7 in_register_00000031;
  long lVar4;
  long lVar5;
  size_t x;
  ulong uVar6;
  PSpriteAmiga PVar7;
  size_t res_width;
  ulong local_28;
  
  lVar5 = CONCAT71(in_register_00000031,return_right);
  local_28 = *(ulong *)(lVar5 + 0x28) >> 1;
  std::make_shared<DataSourceAmiga::SpriteAmiga,unsigned_long&,unsigned_long&>
            ((unsigned_long *)this,&local_28);
  p_Var2 = (this->super_SpriteBase).super_Sprite._vptr_Sprite[7];
  _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar6 = 0;
  if (in_EDX != 0) {
    uVar6 = local_28;
  }
  lVar4 = uVar6 * 4 + *(long *)(lVar5 + 0x38);
  p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar5 + 0x30);
  for (; _Var3._M_pi != p_Var1;
      _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + 1)) {
    lVar5 = 0;
    for (uVar6 = 0; local_28 != uVar6; uVar6 = uVar6 + 1) {
      *(undefined4 *)(p_Var2 + uVar6 * 4) = *(undefined4 *)(lVar4 + uVar6 * 4);
      lVar5 = lVar5 + -4;
    }
    lVar4 = (lVar4 + local_28 * 4) - lVar5;
    p_Var2 = p_Var2 + -lVar5;
  }
  PVar7.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  PVar7.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (PSpriteAmiga)
         PVar7.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DataSourceAmiga::PSpriteAmiga
DataSourceAmiga::SpriteAmiga::split_horizontaly(bool return_right) {
  size_t res_width = width/2;
  PSpriteAmiga s = std::make_shared<SpriteAmiga>(res_width, height);
  uint32_t *src = reinterpret_cast<uint32_t*>(data);
  uint32_t *res = reinterpret_cast<uint32_t*>(s->data);
  if (return_right) {
    src += res_width;
  }
  for (size_t y = 0; y < height; y++) {
    for (size_t x = 0; x < res_width; x++) {
      *res++ = *src++;
    }
    src += res_width;
  }

  return s;
}